

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_verifier.cpp
# Opt level: O1

string * __thiscall
duckdb::StatementVerifier::CompareResults_abi_cxx11_
          (string *__return_storage_ptr__,StatementVerifier *this,StatementVerifier *other)

{
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  pointer pMVar5;
  long *plVar6;
  ColumnDataCollection *left;
  ColumnDataCollection *right;
  undefined8 *puVar7;
  size_type *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str_1;
  undefined8 uVar9;
  ulong uVar10;
  _Alloc_hider _Var11;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this_01 = &this->materialized_result;
  pMVar5 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->(this_01);
  bVar3 = BaseQueryResult::HasError((BaseQueryResult *)pMVar5);
  this_00 = &other->materialized_result;
  pMVar5 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->(this_00);
  bVar4 = BaseQueryResult::HasError((BaseQueryResult *)pMVar5);
  if (bVar3 == bVar4) {
    pMVar5 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_01);
    bVar3 = BaseQueryResult::HasError((BaseQueryResult *)pMVar5);
    if (bVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,anon_var_dwarf_4f001a4 + 9);
      goto LAB_018163c2;
    }
    pMVar5 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_01);
    left = MaterializedQueryResult::Collection(pMVar5);
    pMVar5 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_00);
    right = MaterializedQueryResult::Collection(pMVar5);
    bVar3 = ColumnDataCollection::ResultEquals(left,right,&local_50,false);
    if (bVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,anon_var_dwarf_4f001a4 + 9);
      goto LAB_018163c2;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (other->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (other->name)._M_string_length);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar5 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_01);
    (*(pMVar5->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult[4])(&local_90);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1e54769);
    paVar12 = &local_b0.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)paVar12;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar12) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    pcVar2 = (other->name)._M_dataplus._M_p;
    local_90 = &local_80;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + (other->name)._M_string_length);
    ::std::__cxx11::string::append((char *)&local_90);
    pMVar5 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_00);
    (*(pMVar5->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult[4])(&local_70,pMVar5);
    uVar9 = 0xf;
    if (local_90 != &local_80) {
      uVar9 = local_80._M_allocated_capacity;
    }
    if ((ulong)uVar9 < (ulong)(local_68 + local_88)) {
      uVar10 = 0xf;
      if (local_70 != local_60) {
        uVar10 = local_60[0];
      }
      if (uVar10 < (ulong)(local_68 + local_88)) goto LAB_018164bf;
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_018164bf:
      puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
    }
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = puVar7[3];
      local_b0._M_dataplus._M_p = (pointer)paVar12;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)psVar8 = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar12) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    ::std::operator+(&local_b0,"\n\n---------------------------------\n",&local_50);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    _Var11._M_p = local_b0._M_dataplus._M_p;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (other->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (other->name)._M_string_length);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar5 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_01);
    (*(pMVar5->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult[4])(&local_90);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1e54769);
    paVar1 = &local_b0.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    paVar12 = &local_80;
    if (local_90 != paVar12) {
      operator_delete(local_90);
    }
    pcVar2 = (other->name)._M_dataplus._M_p;
    local_90 = paVar12;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + (other->name)._M_string_length);
    ::std::__cxx11::string::append((char *)&local_90);
    pMVar5 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_00);
    (*(pMVar5->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult[4])(&local_70,pMVar5);
    uVar9 = 0xf;
    if (local_90 != paVar12) {
      uVar9 = local_80._M_allocated_capacity;
    }
    if ((ulong)uVar9 < (ulong)(local_68 + local_88)) {
      uVar10 = 0xf;
      if (local_70 != local_60) {
        uVar10 = local_60[0];
      }
      if (uVar10 < (ulong)(local_68 + local_88)) goto LAB_01816290;
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_01816290:
      puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
    }
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = puVar7[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)psVar8 = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    _Var11._M_p = (pointer)local_90;
    if (local_70 != local_60) {
      operator_delete(local_70);
      _Var11._M_p = (pointer)local_90;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var11._M_p != paVar12) {
    operator_delete(_Var11._M_p);
  }
LAB_018163c2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string StatementVerifier::CompareResults(const StatementVerifier &other) {
	D_ASSERT(type == VerificationType::ORIGINAL);
	string error;
	if (materialized_result->HasError() != other.materialized_result->HasError()) { // LCOV_EXCL_START
		string result = other.name + " statement differs from original result!\n";
		result += "Original Result:\n" + materialized_result->ToString();
		result += other.name + ":\n" + other.materialized_result->ToString();
		return result;
	} // LCOV_EXCL_STOP
	if (materialized_result->HasError()) {
		return "";
	}
	if (!ColumnDataCollection::ResultEquals(materialized_result->Collection(), other.materialized_result->Collection(),
	                                        error)) { // LCOV_EXCL_START
		string result = other.name + " statement differs from original result!\n";
		result += "Original Result:\n" + materialized_result->ToString();
		result += other.name + ":\n" + other.materialized_result->ToString();
		result += "\n\n---------------------------------\n" + error;
		return result;
	} // LCOV_EXCL_STOP

	return "";
}